

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<float,long_double>
                 (float *x,size_t n_,MissingAction missing_action,float *w)

{
  size_t sVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  double dVar9;
  longdouble local_74;
  long local_68;
  ushort uStack_60;
  longdouble local_50;
  
  if (n_ != 0) {
    lVar5 = (longdouble)0;
    sVar1 = 0;
    lVar6 = lVar5;
    lVar7 = lVar5;
    lVar8 = lVar5;
    local_74 = lVar5;
    local_50 = lVar5;
    do {
      if ((uint)ABS(x[sVar1]) < 0x7f800000) {
        lVar2 = (longdouble)w[sVar1];
        lVar5 = lVar5 + lVar2;
        lVar3 = (longdouble)x[sVar1] - lVar8;
        lVar4 = lVar3 / lVar5;
        lVar3 = lVar7 * lVar4 * lVar3;
        lVar8 = lVar2 * lVar4 + lVar8;
        local_74 = local_74 +
                   lVar2 * (lVar4 * (longdouble)-4.0 * local_50 +
                           lVar4 * lVar4 * lVar3 *
                           (lVar5 * lVar5 + (longdouble)-3.0 * lVar5 + (longdouble)3.0) +
                           lVar4 * lVar4 * (longdouble)6.0 * lVar6);
        local_50 = ((longdouble)-3.0 * lVar4 * lVar6 + (lVar5 + (longdouble)-2.0) * lVar3 * lVar4) *
                   lVar2 + local_50;
        lVar6 = lVar3 * lVar2 + lVar6;
        lVar7 = lVar5;
      }
      sVar1 = sVar1 + 1;
    } while (n_ != sVar1);
    if ((longdouble)0 < lVar5) {
      lVar5 = (lVar5 / lVar6) * (local_74 / lVar6);
      uStack_60 = (ushort)((unkuint10)lVar5 >> 0x40);
      local_68 = SUB108(lVar5,0);
      if (((unkuint10)lVar5 & 0x7fff) == 0 ||
          (ushort)((uStack_60 & 0x7fff) - 1) < 0x7ffe && local_68 < 0) {
        dVar9 = (double)lVar5;
        if (dVar9 <= 0.0) {
          dVar9 = 0.0;
        }
        return dVar9;
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(real_t *restrict x, size_t n_, MissingAction missing_action, real_t *restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = 0; row < n_; row++)
    {
        if (likely(!is_na_or_inf(x[row])))
        {
            w_this = w[row];
            n += w_this;

            delta      =  x[row] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}